

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
slang::SmallVector<slang::syntax::ElementSelectSyntax_*,_5UL>::SmallVector
          (SmallVector<slang::syntax::ElementSelectSyntax_*,_5UL> *this,size_type capacity)

{
  (this->super_SmallVectorBase<slang::syntax::ElementSelectSyntax_*>).data_ =
       (pointer)(this->super_SmallVectorBase<slang::syntax::ElementSelectSyntax_*>).firstElement;
  (this->super_SmallVectorBase<slang::syntax::ElementSelectSyntax_*>).len = 0;
  (this->super_SmallVectorBase<slang::syntax::ElementSelectSyntax_*>).cap = 5;
  SmallVectorBase<slang::syntax::ElementSelectSyntax_*>::reserve
            (&this->super_SmallVectorBase<slang::syntax::ElementSelectSyntax_*>,capacity);
  return;
}

Assistant:

explicit SmallVector(size_type capacity, UninitializedTag) : Base(N) {
        this->reserve(capacity);
    }